

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver.hpp
# Opt level: O3

results_type * __thiscall
webfront::http::std::experimental::net::v1::ip::basic_resolver<std::experimental::net::v1::ip::tcp>
::resolve(results_type *__return_storage_ptr__,
         basic_resolver<std::experimental::net::v1::ip::tcp> *this,string_view host,
         string_view service,flags resolve_flags)

{
  error_code __ec;
  error_code ec;
  basic_resolver_query<std::experimental::net::v1::ip::tcp> q;
  string local_f0;
  error_code local_d0;
  string local_c0;
  basic_resolver_query<std::experimental::net::v1::ip::tcp> local_a0;
  
  local_d0._M_value = 0;
  local_d0._M_cat = (error_category *)::std::_V2::system_category();
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,host._M_str,host._M_str + host._M_len);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,service._M_str,service._M_str + service._M_len);
  basic_resolver_query<std::experimental::net::v1::ip::tcp>::basic_resolver_query
            (&local_a0,&local_f0,&local_c0,resolve_flags);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  detail::resolver_service<std::experimental::net::v1::ip::tcp>::resolve
            (__return_storage_ptr__,
             (this->
             super_basic_io_object<std::experimental::net::v1::detail::resolver_service<std::experimental::net::v1::ip::tcp>,_true>
             ).service_,
             &(this->
              super_basic_io_object<std::experimental::net::v1::detail::resolver_service<std::experimental::net::v1::ip::tcp>,_true>
              ).implementation_,&local_a0,&local_d0);
  __ec._4_4_ = 0;
  __ec._M_value = local_d0._M_value;
  if (local_d0._M_value != 0) {
    __ec._M_cat = local_d0._M_cat;
    system_error::system_error((system_error *)&local_f0,__ec,"resolve");
    detail::throw_exception<std::system_error>((system_error *)&local_f0);
    ::std::system_error::~system_error((system_error *)&local_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.service_name_._M_dataplus._M_p != &local_a0.service_name_.field_2) {
    operator_delete(local_a0.service_name_._M_dataplus._M_p,
                    local_a0.service_name_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.host_name_._M_dataplus._M_p != &local_a0.host_name_.field_2) {
    operator_delete(local_a0.host_name_._M_dataplus._M_p,
                    local_a0.host_name_.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

results_type resolve(NET_TS_STRING_VIEW_PARAM host,
      NET_TS_STRING_VIEW_PARAM service, resolver_base::flags resolve_flags)
  {
    std::error_code ec;
    basic_resolver_query<protocol_type> q(static_cast<std::string>(host),
        static_cast<std::string>(service), resolve_flags);
    results_type r = this->get_service().resolve(
        this->get_implementation(), q, ec);
    std::experimental::net::v1::detail::throw_error(ec, "resolve");
    return r;
  }